

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O3

loader_handle mock_loader_impl_load_from_package(loader_impl impl,char *path)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)malloc(8);
  if (puVar1 != (undefined8 *)0x0) {
    log_write_impl_va("metacall",0x17b,"mock_loader_impl_load_from_package",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Mock module %s loaded from package",path);
    *puVar1 = 0;
  }
  return puVar1;
}

Assistant:

loader_handle mock_loader_impl_load_from_package(loader_impl impl, const loader_path path)
{
	loader_impl_mock_handle handle = malloc(sizeof(struct loader_impl_mock_handle_type));

	(void)impl;

	if (handle != NULL)
	{
		log_write("metacall", LOG_LEVEL_DEBUG, "Mock module %s loaded from package", path);

		handle->handle_mock_data = NULL;

		return (loader_handle)handle;
	}

	return NULL;
}